

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_argb.cc
# Opt level: O1

int NV12ToARGBMatrix(uint8_t *src_y,int src_stride_y,uint8_t *src_uv,int src_stride_uv,
                    uint8_t *dst_argb,int dst_stride_argb,YuvConstants *yuvconstants,int width,
                    int height)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  code *pcVar4;
  code *pcVar5;
  
  iVar1 = -1;
  if (height != 0 &&
      (0 < width &&
      (dst_argb != (uint8_t *)0x0 && (src_uv != (uint8_t *)0x0 && src_y != (uint8_t *)0x0)))) {
    uVar2 = height;
    if (height < 0) {
      uVar2 = -height;
      dst_argb = dst_argb + ~height * dst_stride_argb;
      dst_stride_argb = -dst_stride_argb;
    }
    uVar3 = cpu_info_;
    if (cpu_info_ == 0) {
      uVar3 = InitCpuFlags();
    }
    if ((width & 7U) == 0) {
      pcVar5 = NV12ToARGBRow_SSSE3;
    }
    else {
      pcVar5 = NV12ToARGBRow_Any_SSSE3;
    }
    if ((uVar3 & 0x40) == 0) {
      pcVar5 = NV12ToARGBRow_C;
    }
    uVar3 = cpu_info_;
    if (cpu_info_ == 0) {
      uVar3 = InitCpuFlags();
    }
    if ((width & 0xfU) == 0) {
      pcVar4 = NV12ToARGBRow_AVX2;
    }
    else {
      pcVar4 = NV12ToARGBRow_Any_AVX2;
    }
    if ((uVar3 >> 10 & 1) == 0) {
      pcVar4 = pcVar5;
    }
    if (0 < (int)uVar2) {
      uVar3 = 0;
      do {
        (*pcVar4)(src_y,src_uv,dst_argb,yuvconstants,width);
        dst_argb = dst_argb + dst_stride_argb;
        src_y = src_y + src_stride_y;
        src_uv = src_uv + (int)(-(uVar3 & 1) & src_stride_uv);
        uVar3 = uVar3 + 1;
      } while (uVar2 != uVar3);
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

LIBYUV_API
int NV12ToARGBMatrix(const uint8_t* src_y,
                     int src_stride_y,
                     const uint8_t* src_uv,
                     int src_stride_uv,
                     uint8_t* dst_argb,
                     int dst_stride_argb,
                     const struct YuvConstants* yuvconstants,
                     int width,
                     int height) {
  int y;
  void (*NV12ToARGBRow)(
      const uint8_t* y_buf, const uint8_t* uv_buf, uint8_t* rgb_buf,
      const struct YuvConstants* yuvconstants, int width) = NV12ToARGBRow_C;
  if (!src_y || !src_uv || !dst_argb || width <= 0 || height == 0) {
    return -1;
  }
  // Negative height means invert the image.
  if (height < 0) {
    height = -height;
    dst_argb = dst_argb + (height - 1) * dst_stride_argb;
    dst_stride_argb = -dst_stride_argb;
  }
#if defined(HAS_NV12TOARGBROW_SSSE3)
  if (TestCpuFlag(kCpuHasSSSE3)) {
    NV12ToARGBRow = NV12ToARGBRow_Any_SSSE3;
    if (IS_ALIGNED(width, 8)) {
      NV12ToARGBRow = NV12ToARGBRow_SSSE3;
    }
  }
#endif
#if defined(HAS_NV12TOARGBROW_AVX2)
  if (TestCpuFlag(kCpuHasAVX2)) {
    NV12ToARGBRow = NV12ToARGBRow_Any_AVX2;
    if (IS_ALIGNED(width, 16)) {
      NV12ToARGBRow = NV12ToARGBRow_AVX2;
    }
  }
#endif
#if defined(HAS_NV12TOARGBROW_NEON)
  if (TestCpuFlag(kCpuHasNEON)) {
    NV12ToARGBRow = NV12ToARGBRow_Any_NEON;
    if (IS_ALIGNED(width, 8)) {
      NV12ToARGBRow = NV12ToARGBRow_NEON;
    }
  }
#endif
#if defined(HAS_NV12TOARGBROW_MMI)
  if (TestCpuFlag(kCpuHasMMI)) {
    NV12ToARGBRow = NV12ToARGBRow_Any_MMI;
    if (IS_ALIGNED(width, 4)) {
      NV12ToARGBRow = NV12ToARGBRow_MMI;
    }
  }
#endif
#if defined(HAS_NV12TOARGBROW_MSA)
  if (TestCpuFlag(kCpuHasMSA)) {
    NV12ToARGBRow = NV12ToARGBRow_Any_MSA;
    if (IS_ALIGNED(width, 8)) {
      NV12ToARGBRow = NV12ToARGBRow_MSA;
    }
  }
#endif

  for (y = 0; y < height; ++y) {
    NV12ToARGBRow(src_y, src_uv, dst_argb, yuvconstants, width);
    dst_argb += dst_stride_argb;
    src_y += src_stride_y;
    if (y & 1) {
      src_uv += src_stride_uv;
    }
  }
  return 0;
}